

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_union.cc
# Opt level: O3

void __thiscall
S2RegionUnion::S2RegionUnion
          (S2RegionUnion *this,
          vector<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
          *regions)

{
  vector<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  local_28;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2RegionUnion_002bd050;
  (this->regions_).
  super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->regions_).
  super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->regions_).
  super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.
  super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (regions->
       super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (regions->
       super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (regions->
       super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (regions->
  super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (regions->
  super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (regions->
  super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Init(this,&local_28);
  std::
  vector<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

S2RegionUnion::S2RegionUnion(vector<std::unique_ptr<S2Region>> regions) {
  Init(std::move(regions));
}